

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O2

void SampleMuxerMetadata::WriteCueSettings(settings_t *settings,string *pf)

{
  char cVar1;
  _Self __tmp;
  _List_node_base *p_Var2;
  
  p_Var2 = (settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  cVar1 = (char)pf;
  if (p_Var2 != (_List_node_base *)settings) {
    while( true ) {
      p_Var2 = (((_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_> *)
                &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      std::__cxx11::string::append((string *)pf);
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::append((string *)pf);
      if (p_Var2 == (_List_node_base *)settings) break;
      std::__cxx11::string::push_back(cVar1);
    }
  }
  std::__cxx11::string::push_back(cVar1);
  return;
}

Assistant:

void SampleMuxerMetadata::WriteCueSettings(const cue_t::settings_t& settings,
                                           std::string* pf) {
  if (settings.empty()) {
    pf->push_back('\x0A');  // LF
    return;
  }

  typedef cue_t::settings_t::const_iterator iter_t;

  iter_t i = settings.begin();
  const iter_t j = settings.end();

  for (;;) {
    const libwebvtt::Setting& setting = *i++;

    pf->append(setting.name);
    pf->push_back(':');
    pf->append(setting.value);

    if (i == j)
      break;

    pf->push_back(' ');  // separate settings with whitespace
  }

  pf->push_back('\x0A');  // LF
}